

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

void Cmd_dumplinktable(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (1 < Displacements.size) {
    iVar2 = 1;
    do {
      if (1 < Displacements.size) {
        iVar3 = 1;
        do {
          iVar1 = Displacements.size * iVar3 + iVar2;
          Printf("%c%c(%6d, %6d)",0x1c,(ulong)(Displacements.data.Array[iVar1].indirect + 0x43),
                 (ulong)(uint)(int)Displacements.data.Array[iVar1].pos.X,
                 (ulong)(uint)(int)Displacements.data.Array[iVar1].pos.Y);
          iVar3 = iVar3 + 1;
        } while (iVar3 < Displacements.size);
      }
      Printf("\n");
      iVar2 = iVar2 + 1;
    } while (iVar2 < Displacements.size);
  }
  return;
}

Assistant:

CCMD(dumplinktable)
{
	for (int x = 1; x < Displacements.size; x++)
	{
		for (int y = 1; y < Displacements.size; y++)
		{
			FDisplacement &disp = Displacements(x, y);
			Printf("%c%c(%6d, %6d)", TEXTCOLOR_ESCAPE, 'C' + disp.indirect, int(disp.pos.X), int(disp.pos.Y));
		}
		Printf("\n");
	}
}